

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall
re2::PrefilterTree::AssignUniqueIds
          (PrefilterTree *this,NodeMap *nodes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atom_vec)

{
  pointer ppPVar1;
  pointer pEVar2;
  pointer piVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer ppVar4;
  int iVar5;
  ulong uVar6;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *pvVar7;
  Prefilter *pPVar8;
  Prefilter *pPVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __position;
  ostream *this_01;
  size_t i;
  ulong uVar10;
  size_t j;
  pointer ppVar11;
  PrefilterTree *this_02;
  int iVar12;
  long lVar13;
  size_t j_2;
  __type_conflict _Var14;
  Prefilter *node;
  int unique_id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_200;
  PrefilterTree *local_1f8;
  int id_1;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> v;
  int child_id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  entries_by_num_edges;
  
  local_200 = atom_vec;
  local_1f8 = (PrefilterTree *)nodes;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(atom_vec);
  v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar10 = 0;
      ppPVar1 = (this->prefilter_vec_).
                super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->prefilter_vec_).
                             super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar10 = uVar10 + 1) {
    entries_by_num_edges.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppPVar1[uVar10];
    if ((Prefilter *)
        entries_by_num_edges.
        super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (Prefilter *)0x0) {
      node = (Prefilter *)CONCAT44(node._4_4_,(int)uVar10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->unfiltered_,(int *)&node);
    }
    std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
              (&v,(value_type *)&entries_by_num_edges);
  }
  uVar10 = 0;
  while( true ) {
    this_00 = local_200;
    uVar6 = (long)v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 <= uVar10) break;
    pPVar8 = v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10];
    if ((pPVar8 != (Prefilter *)0x0) && (pPVar8->op_ - AND < 2)) {
      pvVar7 = Prefilter::subs(pPVar8);
      lVar13 = 0;
      for (uVar6 = 0;
          ppPVar1 = (pvVar7->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          uVar6 < (ulong)((long)(pvVar7->
                                super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
          uVar6 = uVar6 + 1) {
        std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
                  (&v,(value_type *)((long)ppPVar1 + lVar13));
        lVar13 = lVar13 + 8;
      }
    }
    uVar10 = uVar10 + 1;
  }
  unique_id = 0;
  for (uVar6 = uVar6 & 0xffffffff; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    node = v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6 - 1];
    if (node != (Prefilter *)0x0) {
      node->unique_id_ = -1;
      this_02 = local_1f8;
      pPVar8 = CanonicalNode(this,(NodeMap *)local_1f8,node);
      if (pPVar8 == (Prefilter *)0x0) {
        NodeString_abi_cxx11_((string *)&entries_by_num_edges,this_02,node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,re2::Prefilter*>,std::_Select1st<std::pair<std::__cxx11::string_const,re2::Prefilter*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,re2::Prefilter*>>>
        ::_M_emplace_unique<std::__cxx11::string,re2::Prefilter*&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,re2::Prefilter*>,std::_Select1st<std::pair<std::__cxx11::string_const,re2::Prefilter*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,re2::Prefilter*>>>
                    *)local_1f8,(string *)&entries_by_num_edges,&node);
        std::__cxx11::string::~string((string *)&entries_by_num_edges);
        if (node->op_ == ATOM) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,&node->atom_);
          std::vector<int,_std::allocator<int>_>::push_back(&this->atom_index_to_id_,&unique_id);
        }
        iVar5 = unique_id;
        unique_id = unique_id + 1;
      }
      else {
        iVar5 = pPVar8->unique_id_;
      }
      node->unique_id_ = iVar5;
    }
  }
  std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::resize
            (&this->entries_,(long)unique_id);
  uVar10 = (ulong)((long)v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  do {
    do {
      do {
        if ((int)uVar10 < 1) {
          uVar10 = 0;
          do {
            ppPVar1 = (this->prefilter_vec_).
                      super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar6 = (long)(this->prefilter_vec_).
                          super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
            if (uVar6 <= uVar10) {
              local_1c0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)std::log<unsigned_long>
                                       (uVar6 - ((long)(this->unfiltered_).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(this->unfiltered_).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start >>
                                                2));
              entries_by_num_edges.
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              entries_by_num_edges.
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              entries_by_num_edges.
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar10 = (ulong)((long)v.
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)v.
                                    super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
              while (0 < (int)uVar10) {
                pPVar8 = v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar10 - 1];
                uVar10 = uVar10 - 1;
                if ((pPVar8 != (Prefilter *)0x0) && (pPVar8->op_ == AND)) {
                  pPVar9 = CanonicalNode(this,(NodeMap *)local_1f8,pPVar8);
                  if (pPVar9 == pPVar8) {
                    id_1 = pPVar8->unique_id_;
                    if (entries_by_num_edges.
                        super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        entries_by_num_edges.
                        super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      entries_by_num_edges.
                      super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           entries_by_num_edges.
                           super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    }
                    uVar6 = 0;
                    while( true ) {
                      pvVar7 = Prefilter::subs(pPVar8);
                      if ((ulong)((long)(pvVar7->
                                        super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar7->
                                        super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6)
                      break;
                      pvVar7 = Prefilter::subs(pPVar8);
                      child_id = (pvVar7->
                                 super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar6]->unique_id_;
                      pEVar2 = (this->entries_).
                               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      node = (Prefilter *)
                             ((long)*(pointer *)
                                     ((long)&pEVar2[child_id].parents.
                                             super__Vector_base<int,_std::allocator<int>_> + 8) -
                              *(long *)&pEVar2[child_id].parents.
                                        super__Vector_base<int,_std::allocator<int>_> >> 2);
                      std::
                      vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                      ::emplace_back<unsigned_long,int&>
                                ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                                  *)&entries_by_num_edges,(unsigned_long *)&node,&child_id);
                      uVar6 = uVar6 + 1;
                    }
                    std::
                    __stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,int>*,std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (entries_by_num_edges.
                               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               entries_by_num_edges.
                               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                    ppVar4 = entries_by_num_edges.
                             super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    local_200 = local_1c0;
                    for (ppVar11 = entries_by_num_edges.
                                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar4;
                        ppVar11 = ppVar11 + 1) {
                      iVar5 = ppVar11->second;
                      pEVar2 = (this->entries_).
                               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      lVar13 = *(long *)&pEVar2[iVar5].parents.
                                         super__Vector_base<int,_std::allocator<int>_>;
                      piVar3 = *(pointer *)
                                ((long)&pEVar2[iVar5].parents.
                                        super__Vector_base<int,_std::allocator<int>_> + 8);
                      uVar6 = (long)piVar3 - lVar13;
                      if ((double)local_200 <= 0.0) {
                        if (0x24 < uVar6) {
                          __position = std::
                                       __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                                 (lVar13,piVar3,&id_1);
                          if (__position._M_current !=
                              *(pointer *)
                               ((long)&pEVar2[iVar5].parents.
                                       super__Vector_base<int,_std::allocator<int>_> + 8)) {
                            std::vector<int,_std::allocator<int>_>::erase
                                      (&pEVar2[iVar5].parents,(const_iterator)__position._M_current)
                            ;
                            pEVar2 = (this->entries_).
                                     super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                                     ._M_impl.super__Vector_impl_data._M_start + id_1;
                            pEVar2->propagate_up_at_count = pEVar2->propagate_up_at_count + -1;
                          }
                        }
                      }
                      else {
                        _Var14 = std::log<unsigned_long>((long)uVar6 >> 2);
                        local_200 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)(((double)local_200 + _Var14) - (double)local_1c0);
                      }
                    }
                  }
                }
              }
              std::
              _Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ::~_Vector_base(&entries_by_num_edges.
                               super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                             );
              std::_Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::~_Vector_base
                        (&v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)
              ;
              return;
            }
            pPVar8 = ppPVar1[uVar10];
            if (pPVar8 != (Prefilter *)0x0) {
              pPVar8 = CanonicalNode(this,(NodeMap *)local_1f8,pPVar8);
              if ((long)pPVar8->unique_id_ < 0) {
                __assert_fail("(0) <= (id)",
                              "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                              ,0xe7,
                              "void re2::PrefilterTree::AssignUniqueIds(NodeMap *, std::vector<std::string> *)"
                             );
              }
              entries_by_num_edges.
              super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(entries_by_num_edges.
                                     super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar10);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        (&(this->entries_).
                          super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start[pPVar8->unique_id_].regexps,
                         (int *)&entries_by_num_edges);
            }
            uVar10 = uVar10 + 1;
          } while( true );
        }
        pPVar8 = v.super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10 - 1];
        uVar10 = uVar10 - 1;
      } while (pPVar8 == (Prefilter *)0x0);
      pPVar9 = CanonicalNode(this,(NodeMap *)local_1f8,pPVar8);
    } while (pPVar9 != pPVar8);
    iVar5 = pPVar8->unique_id_;
    node = (Prefilter *)CONCAT44(node._4_4_,iVar5);
    if (pPVar8->op_ - AND < 2) {
      uVar6 = 0;
      iVar12 = 0;
      while( true ) {
        pvVar7 = Prefilter::subs(pPVar8);
        if ((ulong)((long)(pvVar7->
                          super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar7->
                          super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) break;
        pvVar7 = Prefilter::subs(pPVar8);
        iVar5 = (pvVar7->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar6]->unique_id_;
        pEVar2 = (this->entries_).
                 super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = *(pointer *)
                  ((long)&pEVar2[iVar5].parents.super__Vector_base<int,_std::allocator<int>_> + 8);
        if ((*(pointer *)&pEVar2[iVar5].parents.super__Vector_base<int,_std::allocator<int>_> ==
             piVar3) || (piVar3[-1] != (int)node)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&pEVar2[iVar5].parents,(value_type_conflict2 *)&node);
          iVar12 = iVar12 + 1;
        }
        uVar6 = uVar6 + 1;
      }
      if (pPVar8->op_ != AND) {
        iVar12 = 1;
      }
      iVar5 = (int)node;
    }
    else {
      iVar12 = 1;
      if (pPVar8->op_ != ATOM) {
        LogMessage::LogMessage
                  ((LogMessage *)&entries_by_num_edges,
                   "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                   ,0xc5);
        this_01 = std::operator<<((ostream *)
                                  &entries_by_num_edges.
                                   super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,"Unexpected op: ");
        std::ostream::operator<<(this_01,pPVar8->op_);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&entries_by_num_edges);
      }
    }
    (this->entries_).
    super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>.
    _M_impl.super__Vector_impl_data._M_start[iVar5].propagate_up_at_count = iVar12;
  } while( true );
}

Assistant:

void PrefilterTree::AssignUniqueIds(NodeMap* nodes,
                                    std::vector<std::string>* atom_vec) {
  atom_vec->clear();

  // Build vector of all filter nodes, sorted topologically
  // from top to bottom in v.
  std::vector<Prefilter*> v;

  // Add the top level nodes of each regexp prefilter.
  for (size_t i = 0; i < prefilter_vec_.size(); i++) {
    Prefilter* f = prefilter_vec_[i];
    if (f == NULL)
      unfiltered_.push_back(static_cast<int>(i));

    // We push NULL also on to v, so that we maintain the
    // mapping of index==regexpid for level=0 prefilter nodes.
    v.push_back(f);
  }

  // Now add all the descendant nodes.
  for (size_t i = 0; i < v.size(); i++) {
    Prefilter* f = v[i];
    if (f == NULL)
      continue;
    if (f->op() == Prefilter::AND || f->op() == Prefilter::OR) {
      const std::vector<Prefilter*>& subs = *f->subs();
      for (size_t j = 0; j < subs.size(); j++)
        v.push_back(subs[j]);
    }
  }

  // Identify unique nodes.
  int unique_id = 0;
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter *node = v[i];
    if (node == NULL)
      continue;
    node->set_unique_id(-1);
    Prefilter* canonical = CanonicalNode(nodes, node);
    if (canonical == NULL) {
      // Any further nodes that have the same node string
      // will find this node as the canonical node.
      nodes->emplace(NodeString(node), node);
      if (node->op() == Prefilter::ATOM) {
        atom_vec->push_back(node->atom());
        atom_index_to_id_.push_back(unique_id);
      }
      node->set_unique_id(unique_id++);
    } else {
      node->set_unique_id(canonical->unique_id());
    }
  }
  entries_.resize(unique_id);

  // Fill the entries.
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter* prefilter = v[i];
    if (prefilter == NULL)
      continue;
    if (CanonicalNode(nodes, prefilter) != prefilter)
      continue;
    int id = prefilter->unique_id();
    switch (prefilter->op()) {
      default:
        LOG(DFATAL) << "Unexpected op: " << prefilter->op();
        return;

      case Prefilter::ATOM:
        entries_[id].propagate_up_at_count = 1;
        break;

      case Prefilter::OR:
      case Prefilter::AND: {
        // For each child, we append our id to the child's list of
        // parent ids... unless we happen to have done so already.
        // The number of appends is the number of unique children,
        // which allows correct upward propagation from AND nodes.
        int up_count = 0;
        for (size_t j = 0; j < prefilter->subs()->size(); j++) {
          int child_id = (*prefilter->subs())[j]->unique_id();
          std::vector<int>& parents = entries_[child_id].parents;
          if (parents.empty() || parents.back() != id) {
            parents.push_back(id);
            up_count++;
          }
        }
        entries_[id].propagate_up_at_count =
            prefilter->op() == Prefilter::AND ? up_count : 1;
        break;
      }
    }
  }

  // For top level nodes, populate regexp id.
  for (size_t i = 0; i < prefilter_vec_.size(); i++) {
    if (prefilter_vec_[i] == NULL)
      continue;
    int id = CanonicalNode(nodes, prefilter_vec_[i])->unique_id();
    DCHECK_LE(0, id);
    Entry* entry = &entries_[id];
    entry->regexps.push_back(static_cast<int>(i));
  }

  // Lastly, using probability-based heuristics, we identify nodes
  // that trigger too many parents and then we try to prune edges.
  // We use logarithms below to avoid the likelihood of underflow.
  double log_num_regexps = std::log(prefilter_vec_.size() - unfiltered_.size());
  // Hoisted this above the loop so that we don't thrash the heap.
  std::vector<std::pair<size_t, int>> entries_by_num_edges;
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter* prefilter = v[i];
    // Pruning applies only to AND nodes because it "just" reduces
    // precision; applied to OR nodes, it would break correctness.
    if (prefilter == NULL || prefilter->op() != Prefilter::AND)
      continue;
    if (CanonicalNode(nodes, prefilter) != prefilter)
      continue;
    int id = prefilter->unique_id();

    // Sort the current node's children by the numbers of parents.
    entries_by_num_edges.clear();
    for (size_t j = 0; j < prefilter->subs()->size(); j++) {
      int child_id = (*prefilter->subs())[j]->unique_id();
      const std::vector<int>& parents = entries_[child_id].parents;
      entries_by_num_edges.emplace_back(parents.size(), child_id);
    }
    std::stable_sort(entries_by_num_edges.begin(), entries_by_num_edges.end());

    // A running estimate of how many regexps will be triggered by
    // pruning the remaining children's edges to the current node.
    // Our nominal target is one, so the threshold is log(1) == 0;
    // pruning occurs iff the child has more than nine edges left.
    double log_num_triggered = log_num_regexps;
    for (const auto& pair : entries_by_num_edges) {
      int child_id = pair.second;
      std::vector<int>& parents = entries_[child_id].parents;
      if (log_num_triggered > 0.) {
        log_num_triggered += std::log(parents.size());
        log_num_triggered -= log_num_regexps;
      } else if (parents.size() > 9) {
        auto it = std::find(parents.begin(), parents.end(), id);
        if (it != parents.end()) {
          parents.erase(it);
          entries_[id].propagate_up_at_count--;
        }
      }
    }
  }
}